

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_tests.cpp
# Opt level: O0

set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *
anon_unknown.dwarf_47aea5::GetKeyData(FlatSigningProvider *provider,int flags)

{
  Span<const_unsigned_char> _vch;
  bool bVar1;
  uint in_EDX;
  set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<CPubKey>,_bool> pVar2;
  type *pubkey;
  type *_;
  map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  *__range1;
  set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *ret;
  const_iterator __end1;
  const_iterator __begin1;
  CPubKey norm_pubkey;
  uchar bytes [33];
  char *in_stack_fffffffffffffe28;
  lazy_ostream *in_stack_fffffffffffffe30;
  basic_cstring<const_char> *in_stack_fffffffffffffe38;
  uchar *in_stack_fffffffffffffe40;
  uchar *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  _Rb_tree_const_iterator<CPubKey> in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  _Rb_tree_const_iterator<CPubKey> in_stack_fffffffffffffe68;
  lazy_ostream local_108;
  undefined1 local_f0 [64];
  _Base_ptr local_b0;
  _Base_ptr local_a8;
  _Base_ptr local_a0;
  undefined1 local_98;
  _Base_ptr local_90;
  undefined1 local_88;
  undefined1 local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_>::set
            ((set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *)in_stack_fffffffffffffe28
            );
  local_a8 = (_Base_ptr)
             std::
             map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
             ::begin((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                      *)in_stack_fffffffffffffe30);
  local_b0 = (_Base_ptr)
             std::
             map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
             ::end((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                    *)in_stack_fffffffffffffe30);
  while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffffe38,
                                 (_Self *)in_stack_fffffffffffffe30), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::_Rb_tree_const_iterator<std::pair<const_CKeyID,_CPubKey>_>::operator*
              ((_Rb_tree_const_iterator<std::pair<const_CKeyID,_CPubKey>_> *)
               in_stack_fffffffffffffe28);
    std::get<0ul,CKeyID_const,CPubKey>((pair<const_CKeyID,_CPubKey> *)in_stack_fffffffffffffe28);
    std::get<1ul,CKeyID_const,CPubKey>((pair<const_CKeyID,_CPubKey> *)in_stack_fffffffffffffe28);
    if ((in_EDX & 0x40) == 0) {
      pVar2 = std::set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_>::insert
                        ((set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *)
                         in_stack_fffffffffffffe38,(value_type *)in_stack_fffffffffffffe30);
      in_stack_fffffffffffffe58 = pVar2.first._M_node;
      in_stack_fffffffffffffe57 = pVar2.second;
      local_a0 = in_stack_fffffffffffffe58._M_node;
      local_98 = in_stack_fffffffffffffe57;
    }
    else {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (in_stack_fffffffffffffe38,(pointer)in_stack_fffffffffffffe30,
                   (unsigned_long)in_stack_fffffffffffffe28);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffe28);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffffe68._M_node,
                   (const_string *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                   (size_t)in_stack_fffffffffffffe58._M_node,
                   (const_string *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  (in_stack_fffffffffffffe30,(char (*) [1])in_stack_fffffffffffffe28);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (in_stack_fffffffffffffe38,(pointer)in_stack_fffffffffffffe30,
                   (unsigned_long)in_stack_fffffffffffffe28);
        local_108._vptr_lazy_ostream._4_4_ = CPubKey::size((CPubKey *)in_stack_fffffffffffffe28);
        local_108._vptr_lazy_ostream._0_4_ = 0x21;
        in_stack_fffffffffffffe38 = (basic_cstring<const_char> *)0x1c13f67;
        in_stack_fffffffffffffe30 = &local_108;
        in_stack_fffffffffffffe28 = "pubkey.size()";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                  (local_f0,&local_108.m_empty,0x66,1,2,
                   (undefined1 *)((long)&local_108._vptr_lazy_ostream + 4));
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_fffffffffffffe28);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      CPubKey::begin((CPubKey *)in_stack_fffffffffffffe28);
      CPubKey::end((CPubKey *)in_stack_fffffffffffffe38);
      std::copy<unsigned_char_const*,unsigned_char*>
                (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                 (uchar *)in_stack_fffffffffffffe38);
      local_38 = 2;
      Span<const_unsigned_char>::Span<33>
                ((Span<const_unsigned_char> *)in_stack_fffffffffffffe28,(uchar (*) [33])0x62c89f);
      _vch.m_size = (size_t)in_stack_fffffffffffffe48;
      _vch.m_data = in_stack_fffffffffffffe40;
      CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffffe38,_vch);
      pVar2 = std::set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_>::insert
                        ((set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *)
                         in_stack_fffffffffffffe38,(value_type *)in_stack_fffffffffffffe30);
      in_stack_fffffffffffffe68 = pVar2.first._M_node;
      in_stack_fffffffffffffe67 = pVar2.second;
      local_90 = in_stack_fffffffffffffe68._M_node;
      local_88 = in_stack_fffffffffffffe67;
    }
    std::_Rb_tree_const_iterator<std::pair<const_CKeyID,_CPubKey>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_CKeyID,_CPubKey>_> *)
               in_stack_fffffffffffffe28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::set<CPubKey> GetKeyData(const FlatSigningProvider& provider, int flags) {
    std::set<CPubKey> ret;
    for (const auto& [_, pubkey] : provider.pubkeys) {
        if (flags & XONLY_KEYS) {
            unsigned char bytes[33];
            BOOST_CHECK_EQUAL(pubkey.size(), 33);
            std::copy(pubkey.begin(), pubkey.end(), bytes);
            bytes[0] = 0x02;
            CPubKey norm_pubkey{bytes};
            ret.insert(norm_pubkey);
        } else {
            ret.insert(pubkey);
        }
    }
    return ret;
}